

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abstract_factory_football_factory.cpp
# Opt level: O2

shared_ptr<abstract_factory::ICloth> __thiscall
abstract_factory::FootballAbstractFactory::GetCloth(FootballAbstractFactory *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<abstract_factory::ICloth> sVar2;
  _func_int **local_18;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_10;
  
  std::make_shared<abstract_factory::FootballCloth>();
  _Var1._M_pi = _Stack_10._M_pi;
  _Stack_10._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_IAbstractFactory)._vptr_IAbstractFactory = local_18;
  this[1].super_IAbstractFactory._vptr_IAbstractFactory = (_func_int **)_Var1._M_pi;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_10);
  sVar2.super___shared_ptr<abstract_factory::ICloth,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar2.super___shared_ptr<abstract_factory::ICloth,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<abstract_factory::ICloth>)
         sVar2.super___shared_ptr<abstract_factory::ICloth,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<ICloth> FootballAbstractFactory::GetCloth() {
    return std::shared_ptr<ICloth>{std::make_shared<FootballCloth>()};
}